

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_cream_pie(obj *obj)

{
  bool bVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *local_38;
  int blindinc;
  boolean several;
  boolean wascreamed;
  boolean wasblind;
  obj *obj_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar8 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar8 = false;
    if (ublindf != (obj *)0x0) {
      bVar8 = ublindf->oartifact == '\x1d';
    }
    bVar8 = (bool)(bVar8 ^ 1);
  }
  cVar2 = (char)u.ucreamed;
  bVar1 = 1 < obj->quan;
  _blindinc = obj;
  if (bVar1) {
    _blindinc = splitobj(obj,1);
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
    pcVar7 = body_part(2);
    pcVar6 = "";
    if (bVar1) {
      pcVar6 = "one of ";
      pcVar5 = xname(_blindinc);
      pcVar5 = the(pcVar5);
      local_38 = makeplural(pcVar5);
    }
    else {
      pcVar5 = xname(_blindinc);
      local_38 = the(pcVar5);
    }
    pline("You immerse your %s in %s%s.",pcVar7,pcVar6,local_38);
  }
  else {
    pline("You give yourself a facial.");
  }
  bVar3 = can_blnd((monst *)0x0,&youmonst,0xfe,_blindinc);
  if (bVar3 != '\0') {
    iVar4 = rnd(0x19);
    u.ucreamed = iVar4 + u.ucreamed;
    make_blinded((ulong)u.uprops[0x1e].intrinsic + (long)iVar4,'\0');
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
        (((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) && (bVar8)))))))) {
      pcVar6 = "";
      if (cVar2 != '\0') {
        pcVar6 = "more ";
      }
      pcVar7 = body_part(2);
      pline("There\'s %ssticky goop all over your %s.",pcVar6,pcVar7);
    }
    else {
      pcVar6 = body_part(2);
      pline("You can\'t see through all the sticky goop on your %s.",pcVar6);
    }
    if (flags.verbose != '\0') {
      pcVar6 = body_part(2);
      pline("Use the command #wipe to clean your %s.",pcVar6);
    }
  }
  if ((*(uint *)&_blindinc->field_0x4a >> 2 & 1) != 0) {
    verbalize("You used it, you bought it!");
    bill_dummy_object(_blindinc);
  }
  obj_extract_self(_blindinc);
  delobj(_blindinc);
  return 1;
}

Assistant:

static int use_cream_pie(struct obj *obj)
{
	boolean wasblind = Blind;
	boolean wascreamed = u.ucreamed;
	boolean several = FALSE;

	if (obj->quan > 1L) {
		several = TRUE;
		obj = splitobj(obj, 1L);
	}
	if (Hallucination)
		pline("You give yourself a facial.");
	else
		pline("You immerse your %s in %s%s.", body_part(FACE),
			several ? "one of " : "",
			several ? makeplural(the(xname(obj))) : the(xname(obj)));
	if (can_blnd(NULL, &youmonst, AT_WEAP, obj)) {
		int blindinc = rnd(25);
		u.ucreamed += blindinc;
		make_blinded(Blinded + (long)blindinc, FALSE);
		if (!Blind || (Blind && wasblind))
			pline("There's %ssticky goop all over your %s.",
				wascreamed ? "more " : "",
				body_part(FACE));
		else /* Blind  && !wasblind */
			pline("You can't see through all the sticky goop on your %s.",
				body_part(FACE));
		if (flags.verbose)
		    pline("Use the command #wipe to clean your %s.", body_part(FACE));
	}
	if (obj->unpaid) {
		verbalize("You used it, you bought it!");
		bill_dummy_object(obj);
	}
	obj_extract_self(obj);
	delobj(obj);
	return 1;
}